

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

void Wlc_BlastDecoder(Gia_Man_t *pNew,int *pNum,int nNum,Vec_Int_t *vTmp,Vec_Int_t *vRes)

{
  int iLit0;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  vRes->nSize = 0;
  if (nNum != 0x1f) {
    uVar1 = 1 << ((byte)nNum & 0x1f);
    if ((int)uVar1 < 2) {
      uVar1 = 1;
    }
    uVar2 = 0;
    do {
      iLit0 = 1;
      if (0 < nNum) {
        uVar3 = 0;
        do {
          if (pNum[uVar3] < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          iLit0 = Gia_ManHashAnd(pNew,iLit0,
                                 pNum[uVar3] ^ (uint)((~uVar2 >> ((uint)uVar3 & 0x1f) & 1) != 0));
          uVar3 = uVar3 + 1;
        } while ((uint)nNum != uVar3);
      }
      Vec_IntPush(vRes,iLit0);
      uVar2 = uVar2 + 1;
    } while (uVar2 != uVar1);
  }
  return;
}

Assistant:

void Wlc_BlastDecoder( Gia_Man_t * pNew, int * pNum, int nNum, Vec_Int_t * vTmp, Vec_Int_t * vRes )
{
    int i, k, nMints = 1 << nNum;
    Vec_IntClear( vRes );
    for ( i = 0; i < nMints; i++ )
    {
        int iMint = 1;
        for ( k = 0; k < nNum; k++ )
            iMint = Gia_ManHashAnd( pNew, iMint, Abc_LitNotCond(pNum[k], !((i >> k) & 1)) );
        Vec_IntPush( vRes, iMint );
    }
}